

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_service.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::ServiceGenerator::GenerateCallMethod
          (ServiceGenerator *this,Printer *printer)

{
  int iVar1;
  string *psVar2;
  mapped_type *pmVar3;
  Descriptor *pDVar4;
  undefined1 qualified;
  int i_00;
  allocator<char> local_161;
  key_type local_160;
  string local_140;
  allocator<char> local_119;
  key_type local_118;
  string local_f8;
  allocator<char> local_d1;
  key_type local_d0;
  string local_b0;
  allocator<char> local_89;
  key_type local_88;
  undefined1 local_58 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  sub_vars;
  MethodDescriptor *method;
  int i;
  Printer *printer_local;
  ServiceGenerator *this_local;
  
  io::Printer::Print(printer,&this->vars_,
                     "void $classname$::CallMethod(const ::google::protobuf::MethodDescriptor* method,\n                             ::google::protobuf::RpcController* controller,\n                             const ::google::protobuf::Message* request,\n                             ::google::protobuf::Message* response,\n                             ::google::protobuf::Closure* done) {\n  GOOGLE_DCHECK_EQ(method->service(), $file_namespace$::file_level_service_descriptors[$index$]);\n  switch(method->index()) {\n"
                    );
  method._4_4_ = 0;
  while( true ) {
    iVar1 = ServiceDescriptor::method_count(this->descriptor_);
    qualified = (undefined1)iVar1;
    if (iVar1 <= (int)method._4_4_) break;
    sub_vars._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)ServiceDescriptor::method(this->descriptor_,method._4_4_);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)local_58);
    psVar2 = MethodDescriptor::name_abi_cxx11_
                       ((MethodDescriptor *)
                        sub_vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"name",&local_89);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_58,&local_88);
    std::__cxx11::string::operator=((string *)pmVar3,(string *)psVar2);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator(&local_89);
    SimpleItoa_abi_cxx11_(&local_b0,(protobuf *)(ulong)method._4_4_,i_00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"index",&local_d1);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_58,&local_d0);
    std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator(&local_d1);
    std::__cxx11::string::~string((string *)&local_b0);
    pDVar4 = MethodDescriptor::input_type
                       ((MethodDescriptor *)
                        sub_vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
    ClassName_abi_cxx11_(&local_f8,(cpp *)pDVar4,(Descriptor *)0x1,(bool)qualified);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"input_type",&local_119)
    ;
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_58,&local_118);
    std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator(&local_119);
    std::__cxx11::string::~string((string *)&local_f8);
    pDVar4 = MethodDescriptor::output_type
                       ((MethodDescriptor *)
                        sub_vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
    ClassName_abi_cxx11_(&local_140,(cpp *)pDVar4,(Descriptor *)0x1,(bool)qualified);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_160,"output_type",&local_161);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_58,&local_160);
    std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_140);
    std::__cxx11::string::~string((string *)&local_160);
    std::allocator<char>::~allocator(&local_161);
    std::__cxx11::string::~string((string *)&local_140);
    io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_58,
                       "    case $index$:\n      $name$(controller,\n             ::google::protobuf::down_cast<const $input_type$*>(request),\n             ::google::protobuf::down_cast< $output_type$*>(response),\n             done);\n      break;\n"
                      );
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_58);
    method._4_4_ = method._4_4_ + 1;
  }
  io::Printer::Print(printer,&this->vars_,
                     "    default:\n      GOOGLE_LOG(FATAL) << \"Bad method index; this should never happen.\";\n      break;\n  }\n}\n\n"
                    );
  return;
}

Assistant:

void ServiceGenerator::GenerateCallMethod(io::Printer* printer) {
  printer->Print(
      vars_,
      "void $classname$::CallMethod(const ::google::protobuf::MethodDescriptor* method,\n"
      "                             ::google::protobuf::RpcController* controller,\n"
      "                             const ::google::protobuf::Message* request,\n"
      "                             ::google::protobuf::Message* response,\n"
      "                             ::google::protobuf::Closure* done) {\n"
      "  GOOGLE_DCHECK_EQ(method->service(), "
      "$file_namespace$::file_level_service_descriptors[$index$]);\n"
      "  switch(method->index()) {\n");

  for (int i = 0; i < descriptor_->method_count(); i++) {
    const MethodDescriptor* method = descriptor_->method(i);
    std::map<string, string> sub_vars;
    sub_vars["name"] = method->name();
    sub_vars["index"] = SimpleItoa(i);
    sub_vars["input_type"] = ClassName(method->input_type(), true);
    sub_vars["output_type"] = ClassName(method->output_type(), true);

    // Note:  down_cast does not work here because it only works on pointers,
    //   not references.
    printer->Print(sub_vars,
      "    case $index$:\n"
      "      $name$(controller,\n"
      "             ::google::protobuf::down_cast<const $input_type$*>(request),\n"
      "             ::google::protobuf::down_cast< $output_type$*>(response),\n"
      "             done);\n"
      "      break;\n");
  }

  printer->Print(vars_,
    "    default:\n"
    "      GOOGLE_LOG(FATAL) << \"Bad method index; this should never happen.\";\n"
    "      break;\n"
    "  }\n"
    "}\n"
    "\n");
}